

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

void tt_cmap13_next(TT_CMap13 cmap)

{
  FT_Byte *pFVar1;
  uint uVar2;
  ulong uVar3;
  FT_ULong FStack_48;
  FT_UInt gindex;
  FT_ULong n;
  FT_ULong char_code;
  FT_ULong glyph_id;
  FT_ULong end;
  FT_ULong start;
  FT_Byte *p;
  FT_Face face;
  TT_CMap13 cmap_local;
  
  if (cmap->cur_charcode < 0xffffffff) {
    n = cmap->cur_charcode + 1;
    for (FStack_48 = cmap->cur_group; FStack_48 < cmap->num_groups; FStack_48 = FStack_48 + 1) {
      pFVar1 = (cmap->cmap).data;
      uVar3 = (ulong)((uint)pFVar1[FStack_48 * 0xc + 0x10] << 0x18 |
                      (uint)pFVar1[FStack_48 * 0xc + 0x11] << 0x10 |
                      (uint)pFVar1[FStack_48 * 0xc + 0x12] << 8 |
                     (uint)pFVar1[FStack_48 * 0xc + 0x13]);
      uVar2 = (uint)pFVar1[FStack_48 * 0xc + 0x18] << 0x18 |
              (uint)pFVar1[FStack_48 * 0xc + 0x19] << 0x10 |
              (uint)pFVar1[FStack_48 * 0xc + 0x1a] << 8 | (uint)pFVar1[FStack_48 * 0xc + 0x1b];
      if (n < uVar3) {
        n = uVar3;
      }
      if (((n <= ((uint)pFVar1[FStack_48 * 0xc + 0x14] << 0x18 |
                  (uint)pFVar1[FStack_48 * 0xc + 0x15] << 0x10 |
                  (uint)pFVar1[FStack_48 * 0xc + 0x16] << 8 | (uint)pFVar1[FStack_48 * 0xc + 0x17]))
          && (uVar2 != 0)) && (uVar2 < (uint)((cmap->cmap).cmap.charmap.face)->num_glyphs)) {
        cmap->cur_charcode = n;
        cmap->cur_gindex = uVar2;
        cmap->cur_group = FStack_48;
        return;
      }
    }
  }
  cmap->valid = '\0';
  return;
}

Assistant:

static void
  tt_cmap13_next( TT_CMap13  cmap )
  {
    FT_Face   face = cmap->cmap.cmap.charmap.face;
    FT_Byte*  p;
    FT_ULong  start, end, glyph_id, char_code;
    FT_ULong  n;
    FT_UInt   gindex;


    if ( cmap->cur_charcode >= 0xFFFFFFFFUL )
      goto Fail;

    char_code = cmap->cur_charcode + 1;

    for ( n = cmap->cur_group; n < cmap->num_groups; n++ )
    {
      p        = cmap->cmap.data + 16 + 12 * n;
      start    = TT_NEXT_ULONG( p );
      end      = TT_NEXT_ULONG( p );
      glyph_id = TT_PEEK_ULONG( p );

      if ( char_code < start )
        char_code = start;

      if ( char_code <= end )
      {
        gindex = (FT_UInt)glyph_id;

        if ( gindex && gindex < (FT_UInt)face->num_glyphs )
        {
          cmap->cur_charcode = char_code;
          cmap->cur_gindex   = gindex;
          cmap->cur_group    = n;

          return;
        }
      }
    }

  Fail:
    cmap->valid = 0;
  }